

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *field,Reader *replacement)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  WirePointer *pWVar7;
  void *pvVar8;
  int iVar9;
  Exception *pEVar10;
  uint64_t uVar11;
  int iVar12;
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition;
  uint discriminant;
  SegmentReader *local_1e0;
  CapTableReader *local_1d8;
  void *local_1d0;
  Fault f;
  uint replacementDiscriminant;
  anon_class_8_1_a7e8901a _kjContextFunc801;
  PointerReader local_180;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:801:5)>
  _kjContext801;
  Maybe<capnp::schema::Field::Reader> local_110;
  Maybe<capnp::schema::Node::Reader> local_d8;
  Maybe<capnp::schema::Field::Reader> local_a0;
  Maybe<capnp::schema::Node::Reader> local_68;
  
  _kjContextFunc801.field = field;
  kj::_::Debug::Context::Context(&_kjContext801.super_Context);
  _kjContext801.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__Context_0027fd50;
  uVar4 = (field->_reader).dataSize;
  discriminant = 0;
  if (0x1f < uVar4) {
    uVar1 = *(ushort *)((long)(field->_reader).data + 2);
    discriminant = 0;
    if (uVar1 != 0) {
      discriminant = (uint)(ushort)~uVar1;
    }
  }
  uVar5 = (replacement->_reader).dataSize;
  replacementDiscriminant = 0;
  if ((0x1f < uVar5) &&
     (uVar1 = *(ushort *)((long)(replacement->_reader).data + 2), replacementDiscriminant = 0,
     uVar1 != 0)) {
    replacementDiscriminant = (uint)(ushort)~uVar1;
  }
  _kjCondition.left = &discriminant;
  _kjCondition.right = &replacementDiscriminant;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = discriminant == replacementDiscriminant;
  _kjContext801.func = &_kjContextFunc801;
  if (!_kjCondition.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[28]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x328,FAILED,"discriminant == replacementDiscriminant",
               "_kjCondition,\"Field discriminant changed.\"",&_kjCondition,
               (char (*) [28])"Field discriminant changed.");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f);
    goto LAB_001afd7f;
  }
  pvVar6 = (field->_reader).data;
  if (0x4f < uVar4) {
    if (*(short *)((long)pvVar6 + 8) == 1) {
      if (0x4f < uVar5) {
        pvVar8 = (replacement->_reader).data;
        sVar3 = *(short *)((long)pvVar8 + 8);
        if (sVar3 == 1) {
          if (uVar4 < 0xc0) {
            _kjCondition.left = (uint *)0x0;
          }
          else {
            _kjCondition.left = *(uint **)((long)pvVar6 + 0x10);
          }
          if (uVar5 < 0xc0) {
            _kjCondition.right = (uint *)0x0;
          }
          else {
            _kjCondition.right = *(uint **)((long)pvVar8 + 0x10);
          }
          _kjCondition.op.content.ptr = " == ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = _kjCondition.left == _kjCondition.right;
          if (!_kjCondition.result) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[17]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x34c,FAILED,
                       "field.getGroup().getTypeId() == replacement.getGroup().getTypeId()",
                       "_kjCondition,\"group id changed\"",
                       (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
                       (char (*) [17])"group id changed");
            this->compatibility = INCOMPATIBLE;
            kj::_::Debug::Fault::~Fault(&f);
          }
          goto LAB_001afd7f;
        }
        if (sVar3 != 0) goto LAB_001afd7f;
      }
      if ((replacement->_reader).pointerCount < 3) {
        f.exception._0_4_ = 0;
        f.exception._4_4_ = 0;
      }
      else {
        f.exception._0_4_ = *(undefined4 *)&(replacement->_reader).segment;
        f.exception._4_4_ = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
      }
      capnp::_::PointerReader::getStruct
                ((StructReader *)&_kjCondition,(PointerReader *)&f,(word *)0x0);
      if ((field->_reader).dataSize < 0xc0) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(uint64_t *)((long)(field->_reader).data + 0x10);
      }
      local_d8.ptr.isSet = true;
      local_d8.ptr.field_1.value._reader.segment = (this->replacementNode)._reader.segment;
      local_d8.ptr.field_1.value._reader.capTable = (this->replacementNode)._reader.capTable;
      local_d8.ptr.field_1.value._reader.data = (this->replacementNode)._reader.data;
      local_d8.ptr.field_1.value._reader.pointers = (this->replacementNode)._reader.pointers;
      local_d8.ptr.field_1._32_4_ = (this->replacementNode)._reader.dataSize;
      local_d8.ptr.field_1._36_2_ = (this->replacementNode)._reader.pointerCount;
      local_d8.ptr.field_1._38_2_ = *(undefined2 *)&(this->replacementNode)._reader.field_0x26;
      local_d8.ptr.field_1._40_8_ = *(undefined8 *)&(this->replacementNode)._reader.nestingLimit;
      local_110.ptr.isSet = true;
      local_110.ptr.field_1.value._reader.segment = (replacement->_reader).segment;
      local_110.ptr.field_1.value._reader.capTable = (replacement->_reader).capTable;
      local_110.ptr.field_1.value._reader.data = (replacement->_reader).data;
      local_110.ptr.field_1.value._reader.pointers = (replacement->_reader).pointers;
      local_110.ptr.field_1._32_4_ = (replacement->_reader).dataSize;
      local_110.ptr.field_1._36_2_ = (replacement->_reader).pointerCount;
      local_110.ptr.field_1._38_2_ = *(undefined2 *)&(replacement->_reader).field_0x26;
      local_110.ptr.field_1._40_8_ = *(undefined8 *)&(replacement->_reader).nestingLimit;
      checkUpgradeToStruct(this,(Reader *)&_kjCondition,uVar11,&local_d8,&local_110);
      goto LAB_001afd7f;
    }
    if (*(short *)((long)pvVar6 + 8) != 0) goto LAB_001afd7f;
  }
  pEVar10 = (Exception *)(field->_reader).segment;
  uVar1 = (field->_reader).pointerCount;
  local_1d0 = (replacement->_reader).data;
  if (0x4f < uVar5) {
    if (*(short *)((long)local_1d0 + 8) == 1) {
      if (uVar1 < 3) {
        pEVar10 = (Exception *)0x0;
      }
      f.exception = pEVar10;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&_kjCondition,(PointerReader *)&f,(word *)0x0);
      if ((replacement->_reader).dataSize < 0xc0) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(uint64_t *)((long)(replacement->_reader).data + 0x10);
      }
      local_68.ptr.isSet = true;
      local_68.ptr.field_1.value._reader.segment = (this->existingNode)._reader.segment;
      local_68.ptr.field_1.value._reader.capTable = (this->existingNode)._reader.capTable;
      local_68.ptr.field_1.value._reader.data = (this->existingNode)._reader.data;
      local_68.ptr.field_1.value._reader.pointers = (this->existingNode)._reader.pointers;
      local_68.ptr.field_1._32_4_ = (this->existingNode)._reader.dataSize;
      local_68.ptr.field_1._36_2_ = (this->existingNode)._reader.pointerCount;
      local_68.ptr.field_1._38_2_ = *(undefined2 *)&(this->existingNode)._reader.field_0x26;
      local_68.ptr.field_1._40_8_ = *(undefined8 *)&(this->existingNode)._reader.nestingLimit;
      local_a0.ptr.isSet = true;
      local_a0.ptr.field_1.value._reader.segment = (field->_reader).segment;
      local_a0.ptr.field_1.value._reader.capTable = (field->_reader).capTable;
      local_a0.ptr.field_1.value._reader.data = (field->_reader).data;
      local_a0.ptr.field_1.value._reader.pointers = (field->_reader).pointers;
      local_a0.ptr.field_1._32_4_ = (field->_reader).dataSize;
      local_a0.ptr.field_1._36_2_ = (field->_reader).pointerCount;
      local_a0.ptr.field_1._38_2_ = *(undefined2 *)&(field->_reader).field_0x26;
      local_a0.ptr.field_1._40_8_ = *(undefined8 *)&(field->_reader).nestingLimit;
      checkUpgradeToStruct(this,(Reader *)&_kjCondition,uVar11,&local_68,&local_a0);
      goto LAB_001afd7f;
    }
    if (*(short *)((long)local_1d0 + 8) != 0) goto LAB_001afd7f;
  }
  f.exception = pEVar10;
  if (uVar1 < 3) {
    f.exception = (Exception *)0x0;
  }
  local_1e0 = (replacement->_reader).segment;
  local_1d8 = (replacement->_reader).capTable;
  pWVar7 = (replacement->_reader).pointers;
  uVar2 = (replacement->_reader).pointerCount;
  iVar12 = (replacement->_reader).nestingLimit;
  capnp::_::PointerReader::getStruct((StructReader *)&_kjCondition,(PointerReader *)&f,(word *)0x0);
  if (uVar2 < 3) {
    local_180.nestingLimit = 0x7fffffff;
    local_180.capTable = (CapTableReader *)0x0;
    local_180.pointer = (WirePointer *)0x0;
    local_180.segment = (SegmentReader *)0x0;
  }
  else {
    local_180.pointer = pWVar7 + 2;
    local_180.capTable = local_1d8;
    local_180.segment = local_1e0;
    local_180.nestingLimit = iVar12;
  }
  capnp::_::PointerReader::getStruct((StructReader *)&f,&local_180,(word *)0x0);
  checkCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f,NO_UPGRADE_TO_STRUCT);
  if (uVar1 < 4) {
    pEVar10 = (Exception *)0x0;
  }
  f.exception = pEVar10;
  capnp::_::PointerReader::getStruct((StructReader *)&_kjCondition,(PointerReader *)&f,(word *)0x0);
  if (uVar2 < 4) {
    iVar12 = 0x7fffffff;
    local_180.capTable = (CapTableReader *)0x0;
    local_180.pointer = (WirePointer *)0x0;
    local_180.segment = (SegmentReader *)0x0;
  }
  else {
    local_180.pointer = pWVar7 + 3;
    local_180.capTable = local_1d8;
    local_180.segment = local_1e0;
  }
  local_180.nestingLimit = iVar12;
  capnp::_::PointerReader::getStruct((StructReader *)&f,&local_180,(word *)0x0);
  checkDefaultCompatibility(this,(Reader *)&_kjCondition,(Reader *)&f);
  iVar9 = 0;
  iVar12 = 0;
  if (0x3f < uVar4) {
    iVar12 = *(int *)((long)pvVar6 + 4);
  }
  if (0x3f < uVar5) {
    iVar9 = *(int *)((long)local_1d0 + 4);
  }
  _kjCondition.left = (uint *)CONCAT44(iVar9,iVar12);
  _kjCondition.right = (uint *)anon_var_dwarf_48971;
  _kjCondition.op.content.ptr = (char *)0x5;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar12 == iVar9);
  if (iVar12 != iVar9) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,char_const(&)[23]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x338,FAILED,"slot.getOffset() == replacementSlot.getOffset()",
               "_kjCondition,\"field position changed\"",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,
               (char (*) [23])"field position changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f);
  }
LAB_001afd7f:
  kj::_::Debug::Context::~Context(&_kjContext801.super_Context);
  return;
}

Assistant:

void checkCompatibility(const schema::Field::Reader& field,
                          const schema::Field::Reader& replacement) {
    KJ_CONTEXT("comparing struct field", field.getName());

    // A field that is initially not in a union can be upgraded to be in one, as long as it has
    // discriminant 0.
    uint discriminant = hasDiscriminantValue(field) ? field.getDiscriminantValue() : 0;
    uint replacementDiscriminant =
        hasDiscriminantValue(replacement) ? replacement.getDiscriminantValue() : 0;
    VALIDATE_SCHEMA(discriminant == replacementDiscriminant, "Field discriminant changed.");

    switch (field.which()) {
      case schema::Field::SLOT: {
        auto slot = field.getSlot();

        switch (replacement.which()) {
          case schema::Field::SLOT: {
            auto replacementSlot = replacement.getSlot();

            checkCompatibility(slot.getType(), replacementSlot.getType(),
                               NO_UPGRADE_TO_STRUCT);
            checkDefaultCompatibility(slot.getDefaultValue(),
                                      replacementSlot.getDefaultValue());

            VALIDATE_SCHEMA(slot.getOffset() == replacementSlot.getOffset(),
                            "field position changed");
            break;
          }
          case schema::Field::GROUP:
            checkUpgradeToStruct(slot.getType(), replacement.getGroup().getTypeId(),
                                 existingNode, field);
            break;
        }

        break;
      }

      case schema::Field::GROUP:
        switch (replacement.which()) {
          case schema::Field::SLOT:
            checkUpgradeToStruct(replacement.getSlot().getType(), field.getGroup().getTypeId(),
                                 replacementNode, replacement);
            break;
          case schema::Field::GROUP:
            VALIDATE_SCHEMA(field.getGroup().getTypeId() == replacement.getGroup().getTypeId(),
                            "group id changed");
            break;
        }
        break;
    }
  }